

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_linux.h
# Opt level: O3

void os_system_linux_netlink_remove(os_system_netlink *nl)

{
  int __fd;
  
  if (((nl->socket).fd._flags & OS_FD_ACTIVE) == 0) {
    return;
  }
  oonf_socket_remove(&nl->socket);
  __fd = (nl->socket).fd.fd;
  if (__fd != -1) {
    close(__fd);
    (nl->socket).fd.fd = -1;
  }
  free(nl->in);
  abuf_free(&nl->out);
  return;
}

Assistant:

static INLINE bool
os_fd_is_initialized(struct os_fd *sock) {
  return (sock->_flags & OS_FD_ACTIVE) != 0;
}